

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O2

void __thiscall
embree::ParallelRadixSort<unsigned_int,_unsigned_int>::tbbRadixSort
          (ParallelRadixSort<unsigned_int,_unsigned_int> *this,size_t numTasks)

{
  TyRadixCount *pauVar1;
  
  pauVar1 = (TyRadixCount *)alignedMalloc(0x10000,0x40);
  this->radixCount = pauVar1;
  tbbRadixIteration(this,0,false,this->src,this->tmp,numTasks);
  tbbRadixIteration(this,8,false,this->tmp,this->src,numTasks);
  tbbRadixIteration(this,0x10,false,this->src,this->tmp,numTasks);
  tbbRadixIteration(this,0x18,true,this->tmp,this->src,numTasks);
  return;
}

Assistant:

void tbbRadixSort(const size_t numTasks)
    {
      radixCount = (TyRadixCount*) alignedMalloc(MAX_TASKS*sizeof(TyRadixCount),64);
      
      if (sizeof(Key) == sizeof(uint32_t)) {
        tbbRadixIteration(0*BITS,0,src,tmp,numTasks);
        tbbRadixIteration(1*BITS,0,tmp,src,numTasks);
        tbbRadixIteration(2*BITS,0,src,tmp,numTasks);
        tbbRadixIteration(3*BITS,1,tmp,src,numTasks);
      }
      else if (sizeof(Key) == sizeof(uint64_t))
      {
        tbbRadixIteration(0*BITS,0,src,tmp,numTasks);
        tbbRadixIteration(1*BITS,0,tmp,src,numTasks);
        tbbRadixIteration(2*BITS,0,src,tmp,numTasks);
        tbbRadixIteration(3*BITS,0,tmp,src,numTasks);
        tbbRadixIteration(4*BITS,0,src,tmp,numTasks);
        tbbRadixIteration(5*BITS,0,tmp,src,numTasks);
        tbbRadixIteration(6*BITS,0,src,tmp,numTasks);
        tbbRadixIteration(7*BITS,1,tmp,src,numTasks);
      }
    }